

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

char * mg_get_option(mg_context *ctx,char *name)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = get_option_index(name);
  if (iVar2 == -1) {
    pcVar3 = (char *)0x0;
  }
  else if (ctx == (mg_context *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar1 = (ctx->dd).config[iVar2];
    pcVar3 = "";
    if (pcVar1 != (char *)0x0) {
      pcVar3 = pcVar1;
    }
  }
  return pcVar3;
}

Assistant:

CIVETWEB_API const char *
mg_get_option(const struct mg_context *ctx, const char *name)
{
	int i;
	if ((i = get_option_index(name)) == -1) {
		return NULL;
	} else if (!ctx || ctx->dd.config[i] == NULL) {
		return "";
	} else {
		return ctx->dd.config[i];
	}
}